

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void character_sit_sleep_common(tgestate_t *state,room_t room,route_t *route)

{
  undefined1 *in_RDX;
  char in_SIL;
  long in_RDI;
  vischar_t *vc;
  characterstruct_t *cs;
  
  *in_RDX = 0;
  if (*(char *)(in_RDI + 0x120) == in_SIL) {
    in_RDX[0x3a] = 0xff;
    setup_room_and_plot((tgestate_t *)0x116270);
  }
  else {
    in_RDX[-4] = 0xff;
  }
  return;
}

Assistant:

static void character_sit_sleep_common(tgestate_t *state,
                                       room_t      room,
                                       route_t    *route)
{
  /* This receives a pointer to a route structure which is within either a
   * characterstruct or a vischar. */

  assert(state != NULL);
  ASSERT_ROOM_VALID(room);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  // sampled HL =
  // breakfast $8022 + + $76B8 $76BF
  // night     $76A3 $76B8 $76C6 $76B1 $76BF $76AA
  // (not always in the same order)
  //
  // $8022 -> vischar[1]->route
  // others -> character_structs->route

  route->index = routeindex_0_HALT; /* Stand still. */

  if (state->room_index != room)
  {
    /* Character is sitting or sleeping in a room presently not visible. */

    characterstruct_t *cs;

    /* Retrieve the parent structure pointer. */
    cs = structof(route, characterstruct_t, route);
    cs->room = room_NONE;
  }
  else
  {
    /* Character is visible - force a repaint. */

    vischar_t *vc;

    /* This is only ever hit when location is in vischar @ $8020. */

    /* Retrieve the parent structure pointer. */
    vc = structof(route, vischar_t, route);
    vc->room = room_NONE; // hides but doesn't disable the character?

    setup_room_and_plot(state);
  }
}